

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O3

void polyscope::warning(string *baseMessage,string *detailMessage)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Deque_base<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
  *this;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  _Map_pointer ppWVar5;
  WarningMessage *pWVar6;
  size_t sVar7;
  long lVar8;
  _Map_pointer ppWVar9;
  long lVar10;
  WarningMessage *w;
  WarningMessage *pWVar11;
  WarningMessage *pWVar12;
  pointer local_80;
  size_type local_78;
  char local_70;
  undefined7 uStack_6f;
  undefined8 uStack_68;
  pointer local_60;
  size_type local_58;
  char local_50;
  undefined7 uStack_4f;
  undefined8 uStack_48;
  int local_40;
  string *local_38;
  
  pWVar6 = DAT_004bd8e0;
  if (_DAT_004bd8c0 == DAT_004bd8e0) {
    sVar7 = baseMessage->_M_string_length;
  }
  else {
    sVar7 = baseMessage->_M_string_length;
    bVar3 = false;
    ppWVar9 = DAT_004bd8d8;
    pWVar11 = _DAT_004bd8c0;
    pWVar12 = _DAT_004bd8d0;
    local_38 = detailMessage;
    do {
      if (((pWVar11->baseMessage)._M_string_length == sVar7) &&
         ((sVar7 == 0 ||
          (iVar4 = bcmp((pWVar11->baseMessage)._M_dataplus._M_p,(baseMessage->_M_dataplus)._M_p,
                        sVar7), iVar4 == 0)))) {
        pWVar11->repeatCount = pWVar11->repeatCount + 1;
        bVar3 = true;
      }
      pWVar11 = pWVar11 + 1;
      if (pWVar11 == pWVar12) {
        pWVar11 = ppWVar9[1];
        ppWVar9 = ppWVar9 + 1;
        pWVar12 = pWVar11 + 7;
      }
    } while (pWVar11 != pWVar6);
    detailMessage = local_38;
    if (bVar3) {
      return;
    }
  }
  pcVar2 = (baseMessage->_M_dataplus)._M_p;
  local_80 = &local_70;
  std::__cxx11::string::_M_construct<char*>((string *)&local_80,pcVar2,pcVar2 + sVar7);
  pcVar2 = (detailMessage->_M_dataplus)._M_p;
  local_60 = &local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + detailMessage->_M_string_length);
  pWVar6 = DAT_004bd8e0;
  local_40 = 0;
  if (DAT_004bd8e0 != _DAT_004bd8f0 + -1) {
    paVar1 = &(DAT_004bd8e0->baseMessage).field_2;
    (DAT_004bd8e0->baseMessage)._M_dataplus._M_p = (pointer)paVar1;
    if (local_80 == &local_70) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_6f,local_70);
      *(undefined8 *)((long)&(pWVar6->baseMessage).field_2 + 8) = uStack_68;
    }
    else {
      (pWVar6->baseMessage)._M_dataplus._M_p = local_80;
      (pWVar6->baseMessage).field_2._M_allocated_capacity = CONCAT71(uStack_6f,local_70);
    }
    (pWVar6->baseMessage)._M_string_length = local_78;
    paVar1 = &(pWVar6->detailMessage).field_2;
    (pWVar6->detailMessage)._M_dataplus._M_p = (pointer)paVar1;
    if (local_60 == &local_50) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_4f,local_50);
      *(undefined8 *)((long)&(pWVar6->detailMessage).field_2 + 8) = uStack_48;
    }
    else {
      (pWVar6->detailMessage)._M_dataplus._M_p = local_60;
      (pWVar6->detailMessage).field_2._M_allocated_capacity = CONCAT71(uStack_4f,local_50);
    }
    (pWVar6->detailMessage)._M_string_length = local_58;
    pWVar6->repeatCount = 0;
    DAT_004bd8e0 = DAT_004bd8e0 + 1;
    return;
  }
  lVar8 = (long)DAT_004bd8f8 - (long)DAT_004bd8d8 >> 3;
  if (((long)_DAT_004bd8d0 - (long)_DAT_004bd8c0 >> 3) * -0x71c71c71c71c71c7 +
      ((long)DAT_004bd8e0 - (long)_DAT_004bd8e8 >> 3) * -0x71c71c71c71c71c7 +
      (lVar8 + -1 + (ulong)(DAT_004bd8f8 == (_Map_pointer)0x0)) * 7 == 0x1c71c71c71c71c7) {
    std::__throw_length_error("cannot create std::deque larger than max_size()");
  }
  if (1 < (ulong)((long)DAT_004bd8b8 -
                 ((long)DAT_004bd8f8 - (long)(anonymous_namespace)::warningMessages >> 3)))
  goto LAB_001caa5b;
  if ((_Deque_base<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
       *)(lVar8 * 2 + 4) < DAT_004bd8b8) {
    ppWVar9 = (anonymous_namespace)::warningMessages +
              ((ulong)((long)DAT_004bd8b8 - (lVar8 + 2)) >> 1);
    if (ppWVar9 < DAT_004bd8d8) {
      sVar7 = (long)DAT_004bd8f8 + (8 - (long)DAT_004bd8d8);
      ppWVar5 = ppWVar9;
      if (sVar7 != 0) {
LAB_001caa16:
        memmove(ppWVar5,DAT_004bd8d8,sVar7);
      }
    }
    else {
      sVar7 = (long)DAT_004bd8f8 + (8 - (long)DAT_004bd8d8);
      if (sVar7 != 0) {
        ppWVar5 = (_Map_pointer)((long)ppWVar9 + ((lVar8 + 1) * 8 - sVar7));
        goto LAB_001caa16;
      }
    }
  }
  else {
    lVar10 = (long)DAT_004bd8b8 * 2 +
             (ulong)(DAT_004bd8b8 ==
                    (_Deque_base<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
                     *)0x0);
    this = (_Deque_base<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
            *)(lVar10 + 2);
    ppWVar5 = std::
              _Deque_base<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
              ::_M_allocate_map(this,(size_t)DAT_004bd8d8);
    ppWVar9 = ppWVar5 + ((ulong)(lVar10 - lVar8) >> 1);
    sVar7 = (long)DAT_004bd8f8 + (8 - (long)DAT_004bd8d8);
    if (sVar7 != 0) {
      memmove(ppWVar9,DAT_004bd8d8,sVar7);
    }
    operator_delete((anonymous_namespace)::warningMessages);
    (anonymous_namespace)::warningMessages = ppWVar5;
    DAT_004bd8b8 = this;
  }
  DAT_004bd8f8 = ppWVar9 + lVar8;
  _DAT_004bd8c8 = *ppWVar9;
  _DAT_004bd8d0 = _DAT_004bd8c8 + 7;
  _DAT_004bd8e8 = *DAT_004bd8f8;
  _DAT_004bd8f0 = _DAT_004bd8e8 + 7;
  DAT_004bd8d8 = ppWVar9;
LAB_001caa5b:
  pWVar6 = (WarningMessage *)operator_new(0x1f8);
  DAT_004bd8f8[1] = pWVar6;
  paVar1 = &(DAT_004bd8e0->baseMessage).field_2;
  (DAT_004bd8e0->baseMessage)._M_dataplus._M_p = (pointer)paVar1;
  if (local_80 == &local_70) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_6f,local_70);
    *(undefined8 *)((long)&(DAT_004bd8e0->baseMessage).field_2 + 8) = uStack_68;
  }
  else {
    (DAT_004bd8e0->baseMessage)._M_dataplus._M_p = local_80;
    (DAT_004bd8e0->baseMessage).field_2._M_allocated_capacity = CONCAT71(uStack_6f,local_70);
  }
  (DAT_004bd8e0->baseMessage)._M_string_length = local_78;
  paVar1 = &(DAT_004bd8e0->detailMessage).field_2;
  (DAT_004bd8e0->detailMessage)._M_dataplus._M_p = (pointer)paVar1;
  if (local_60 == &local_50) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_4f,local_50);
    *(undefined8 *)((long)&(DAT_004bd8e0->detailMessage).field_2 + 8) = uStack_48;
  }
  else {
    (DAT_004bd8e0->detailMessage)._M_dataplus._M_p = local_60;
    (DAT_004bd8e0->detailMessage).field_2._M_allocated_capacity = CONCAT71(uStack_4f,local_50);
  }
  (DAT_004bd8e0->detailMessage)._M_string_length = local_58;
  DAT_004bd8e0->repeatCount = local_40;
  _DAT_004bd8e8 = DAT_004bd8f8[1];
  DAT_004bd8f8 = DAT_004bd8f8 + 1;
  _DAT_004bd8f0 = _DAT_004bd8e8 + 7;
  DAT_004bd8e0 = _DAT_004bd8e8;
  return;
}

Assistant:

void warning(std::string baseMessage, std::string detailMessage) {

  // Look for a message with the same name
  bool found = false;
  for (WarningMessage& w : warningMessages) {
    if (w.baseMessage == baseMessage) {
      found = true;
      w.repeatCount++;
    }
  }

  // Create a new message
  if (!found) {
    warningMessages.push_back(WarningMessage{baseMessage, detailMessage, 0});
  }
}